

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

int tc_uECC_valid_point(tc_uECC_word_t *point,tc_uECC_Curve curve)

{
  tc_uECC_word_t *left;
  byte num_words;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  tc_uECC_word_t local_88 [2];
  tc_uECC_word_t tmp2 [8];
  tc_uECC_word_t local_48 [2];
  tc_uECC_word_t tmp1 [8];
  
  num_words = curve->num_words;
  uVar2 = (uint)num_words;
  if ((char)(num_words * '\x02') < '\x01') {
    return -1;
  }
  uVar4 = 0;
  uVar5 = 0;
  do {
    uVar5 = uVar5 | point[uVar4];
    uVar4 = uVar4 + 1;
  } while ((byte)(num_words * '\x02') != uVar4);
  uVar3 = uVar2;
  if (uVar5 != 0) {
    while( true ) {
      uVar3 = uVar3 - 1;
      if ((char)uVar3 < '\0') {
        return -2;
      }
      uVar4 = (ulong)((uVar3 & 0x7f) << 2);
      uVar5 = *(uint *)((long)curve->p + uVar4);
      uVar1 = *(uint *)((long)point + uVar4);
      if (uVar1 < uVar5) break;
      if (uVar5 < uVar1) {
        return -2;
      }
    }
    left = point + (char)num_words;
    while( true ) {
      uVar2 = uVar2 - 1;
      if ((char)uVar2 < '\0') {
        return -2;
      }
      uVar4 = (ulong)((uVar2 & 0x7f) << 2);
      uVar5 = *(uint *)((long)curve->p + uVar4);
      uVar3 = *(uint *)((long)left + uVar4);
      if (uVar3 < uVar5) break;
      if (uVar5 < uVar3) {
        return -2;
      }
    }
    tc_uECC_vli_mult(local_88,left,left,num_words);
    (*curve->mmod_fast)(local_48,local_88);
    (*curve->x_side)(local_88,point,curve);
    if (-1 < (char)(num_words - 1)) {
      uVar4 = (ulong)(byte)(num_words - 1);
      uVar2 = 0;
      do {
        uVar2 = uVar2 | tmp2[uVar4 - 2] ^ tmp1[uVar4 - 2];
        bVar6 = uVar4 != 0;
        uVar4 = uVar4 - 1;
      } while (bVar6);
      if (uVar2 != 0) {
        return -3;
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int tc_uECC_valid_point(const tc_uECC_word_t *point, tc_uECC_Curve curve)
{
	tc_uECC_word_t tmp1[NUM_ECC_WORDS];
	tc_uECC_word_t tmp2[NUM_ECC_WORDS];
	wordcount_t num_words = curve->num_words;

	/* The point at infinity is invalid. */
	if (EccPoint_isZero(point, curve)) {
		return -1;
	}

	/* x and y must be smaller than p. */
	if (tc_uECC_vli_cmp_unsafe(curve->p, point, num_words) != 1 ||
		tc_uECC_vli_cmp_unsafe(curve->p, point + num_words, num_words) != 1) {
		return -2;
	}

	tc_uECC_vli_modSquare_fast(tmp1, point + num_words, curve);
	curve->x_side(tmp2, point, curve); /* tmp2 = x^3 + ax + b */

	/* Make sure that y^2 == x^3 + ax + b */
	if (tc_uECC_vli_equal(tmp1, tmp2, num_words) != 0)
		return -3;

	return 0;
}